

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.h
# Opt level: O2

void wallet::CHDChain::SerializationOps<DataStream,wallet::CHDChain_const,ActionSerialize>
               (uint *obj,DataStream *s)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SerializeMany<DataStream,int,unsigned_int,CKeyID>(s,(int *)(obj + 0xc),obj,(CKeyID *)(obj + 2));
  if ((int)obj[0xc] < 2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    SerializeMany<DataStream,unsigned_int>(s,obj + 1);
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CHDChain, obj)
    {
        READWRITE(obj.nVersion, obj.nExternalChainCounter, obj.seed_id);
        if (obj.nVersion >= VERSION_HD_CHAIN_SPLIT) {
            READWRITE(obj.nInternalChainCounter);
        }
    }